

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
atoiTest_testUint64OutOfBoundsNegative_Test::~atoiTest_testUint64OutOfBoundsNegative_Test
          (atoiTest_testUint64OutOfBoundsNegative_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(atoiTest, testUint64OutOfBoundsNegative) {
  // out of bounds
  test<uint64_t>(false, "-1111111111111111111111111111111111111111111111111111111111111");
  test<uint64_t>(false, "-1111111111111111111111111111111111111");
  test<uint64_t>(false, "-9223372036854775809"); 
  test<uint64_t>(false, "-9223372036854775808");
  test<uint64_t>(false, "-9223372036854775807");
  test<uint64_t>(false, "-10000");
  test<uint64_t>(false, "-10000");
  test<uint64_t>(false, "-1");
  test<uint64_t>(false, "-0");
}